

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

int NeedWriter(FFSArrayRequest_conflict Req,int i)

{
  size_t *psVar1;
  ulong uVar2;
  FFSVarRec_conflict pFVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  
  if (Req->RequestType == Local) {
    uVar2 = Req->VarRec->PerWriterBlockStart[i];
    uVar5 = 0;
    if (uVar2 <= Req->BlockID) {
      uVar5 = (uint)(Req->BlockID <= (uVar2 + Req->VarRec->PerWriterBlockCount[i]) - 1);
    }
  }
  else {
    pFVar3 = Req->VarRec;
    sVar6 = 0;
    while (pFVar3->DimCount != sVar6) {
      if (pFVar3->PerWriterStart[i] == (size_t *)0x0) {
        return 0;
      }
      psVar1 = Req->Count + sVar6;
      if (*psVar1 == 0) {
        return 0;
      }
      if (pFVar3->PerWriterCounts[i][sVar6] == 0) {
        return 0;
      }
      uVar2 = Req->Start[sVar6];
      uVar4 = pFVar3->PerWriterStart[i][sVar6];
      if (pFVar3->PerWriterCounts[i][sVar6] + uVar4 <= uVar2 && uVar4 < uVar2) {
        return 0;
      }
      sVar6 = sVar6 + 1;
      if (*psVar1 + uVar2 <= uVar4) {
        return 0;
      }
    }
    uVar5 = 1;
  }
  return uVar5;
}

Assistant:

static int NeedWriter(FFSArrayRequest Req, int i)
{
    if (Req->RequestType == Local)
    {
        size_t NodeFirst = Req->VarRec->PerWriterBlockStart[i];
        size_t NodeLast = Req->VarRec->PerWriterBlockCount[i] + NodeFirst - 1;
        return (NodeFirst <= Req->BlockID) && (NodeLast >= Req->BlockID);
    }
    // else Global case
    for (int j = 0; j < Req->VarRec->DimCount; j++)
    {
        size_t SelOffset = Req->Start[j];
        size_t SelSize = Req->Count[j];
        size_t RankOffset;
        size_t RankSize;
        if (Req->VarRec->PerWriterStart[i] == NULL)
        /* this writer didn't write */
        {
            return 0;
        }
        RankOffset = Req->VarRec->PerWriterStart[i][j];
        RankSize = Req->VarRec->PerWriterCounts[i][j];
        if ((SelSize == 0) || (RankSize == 0))
        {
            return 0;
        }
        if ((RankOffset < SelOffset && (RankOffset + RankSize) <= SelOffset) ||
            (RankOffset >= SelOffset + SelSize))
        {
            return 0;
        }
    }
    return 1;
}